

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_aggregate_hashtable.cpp
# Opt level: O0

void __thiscall duckdb::PerfectAggregateHashTable::Destroy(PerfectAggregateHashTable *this)

{
  bool bVar1;
  bool bVar2;
  TupleDataLayout *this_00;
  iterator state;
  iterator layout;
  uchar **count_00;
  long lVar3;
  long in_RDI;
  idx_t i;
  data_ptr_t payload_ptr;
  RowOperationsState row_state;
  idx_t count;
  uchar **data_pointers;
  AggregateObject *aggr;
  iterator __end1;
  iterator __begin1;
  Aggregates *__range1;
  bool has_destructor;
  ArenaAllocator *in_stack_ffffffffffffff78;
  type in_stack_ffffffffffffff80;
  ulong local_60;
  uchar *local_58;
  long local_40;
  reference in_stack_ffffffffffffffd0;
  
  bVar1 = false;
  this_00 = shared_ptr<duckdb::TupleDataLayout,_true>::operator->
                      ((shared_ptr<duckdb::TupleDataLayout,_true> *)in_stack_ffffffffffffff80);
  TupleDataLayout::GetAggregates(this_00);
  state = ::std::vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>::begin
                    ((vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_> *)
                     in_stack_ffffffffffffff78);
  layout = ::std::vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>::end
                     ((vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_> *)
                      in_stack_ffffffffffffff78);
  while (bVar2 = __gnu_cxx::operator!=
                           ((__normal_iterator<duckdb::AggregateObject_*,_std::vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>_>
                             *)in_stack_ffffffffffffff80,
                            (__normal_iterator<duckdb::AggregateObject_*,_std::vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>_>
                             *)in_stack_ffffffffffffff78), bVar2) {
    in_stack_ffffffffffffffd0 =
         __gnu_cxx::
         __normal_iterator<duckdb::AggregateObject_*,_std::vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>_>
         ::operator*((__normal_iterator<duckdb::AggregateObject_*,_std::vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>_>
                      *)&stack0xffffffffffffffe0);
    if ((in_stack_ffffffffffffffd0->function).destructor != (aggregate_destructor_t)0x0) {
      bVar1 = true;
    }
    __gnu_cxx::
    __normal_iterator<duckdb::AggregateObject_*,_std::vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>_>
    ::operator++((__normal_iterator<duckdb::AggregateObject_*,_std::vector<duckdb::AggregateObject,_std::allocator<duckdb::AggregateObject>_>_>
                  *)&stack0xffffffffffffffe0);
  }
  if (bVar1) {
    count_00 = FlatVector::GetData<unsigned_char*>((Vector *)0x79db85);
    local_40 = 0;
    unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>::operator*
              ((unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>
                *)in_stack_ffffffffffffff80);
    RowOperationsState::RowOperationsState
              ((RowOperationsState *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    local_58 = *(uchar **)(in_RDI + 0xf8);
    for (local_60 = 0; local_60 < *(ulong *)(in_RDI + 0xe0); local_60 = local_60 + 1) {
      lVar3 = local_40 + 1;
      count_00[local_40] = local_58;
      local_40 = lVar3;
      if (lVar3 == 0x800) {
        in_stack_ffffffffffffff80 =
             shared_ptr<duckdb::TupleDataLayout,_true>::operator*
                       ((shared_ptr<duckdb::TupleDataLayout,_true> *)in_stack_ffffffffffffff80);
        RowOperations::DestroyStates
                  ((RowOperationsState *)state._M_current,(TupleDataLayout *)layout._M_current,
                   (Vector *)in_stack_ffffffffffffffd0,(idx_t)count_00);
        local_40 = 0;
      }
      local_58 = local_58 + *(long *)(in_RDI + 0xe8);
    }
    shared_ptr<duckdb::TupleDataLayout,_true>::operator*
              ((shared_ptr<duckdb::TupleDataLayout,_true> *)in_stack_ffffffffffffff80);
    RowOperations::DestroyStates
              ((RowOperationsState *)state._M_current,(TupleDataLayout *)layout._M_current,
               (Vector *)in_stack_ffffffffffffffd0,(idx_t)count_00);
    RowOperationsState::~RowOperationsState((RowOperationsState *)0x79dcca);
  }
  return;
}

Assistant:

void PerfectAggregateHashTable::Destroy() {
	// check if there is any destructor to call
	bool has_destructor = false;
	for (auto &aggr : layout_ptr->GetAggregates()) {
		if (aggr.function.destructor) {
			has_destructor = true;
		}
	}
	if (!has_destructor) {
		return;
	}
	// there are aggregates with destructors: loop over the hash table
	// and call the destructor method for each of the aggregates
	auto data_pointers = FlatVector::GetData<data_ptr_t>(addresses);
	idx_t count = 0;

	// iterate over all initialised slots of the hash table
	RowOperationsState row_state(*aggregate_allocator);
	data_ptr_t payload_ptr = data;
	for (idx_t i = 0; i < total_groups; i++) {
		data_pointers[count++] = payload_ptr;
		if (count == STANDARD_VECTOR_SIZE) {
			RowOperations::DestroyStates(row_state, *layout_ptr, addresses, count);
			count = 0;
		}
		payload_ptr += tuple_size;
	}
	RowOperations::DestroyStates(row_state, *layout_ptr, addresses, count);
}